

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  pointer pcVar1;
  bool bVar2;
  string tmp;
  Slice contents;
  string manifest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Status local_90;
  Slice local_88;
  string local_78;
  string local_58;
  Slice local_38;
  
  DescriptorFileName(&local_58,dbname,descriptor_number);
  local_88.data_ = local_58._M_dataplus._M_p;
  local_88.size_ = local_58._M_string_length;
  std::operator+(&local_b0,dbname,"/");
  local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  local_d0._M_string_length = local_b0._M_string_length;
  bVar2 = Slice::starts_with(&local_88,(Slice *)&local_d0);
  if (!bVar2) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::~string((string *)&local_b0);
  Slice::remove_prefix(&local_88,dbname->_M_string_length + 1);
  TempFileName(&local_b0,dbname,descriptor_number);
  Slice::ToString_abi_cxx11_(&local_78,&local_88);
  std::operator+(&local_d0,&local_78,"\n");
  local_38.data_ = local_d0._M_dataplus._M_p;
  local_38.size_ = local_d0._M_string_length;
  WriteStringToFileSync(this,env,&local_38,&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_78);
  if (*(long *)this == 0) {
    CurrentFileName(&local_d0,dbname);
    (*env->_vptr_Env[0xc])(&local_78,env,&local_b0,&local_d0);
    pcVar1 = *(pointer *)this;
    *(pointer *)this = local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = pcVar1;
    Status::~Status((Status *)&local_78);
    std::__cxx11::string::~string((string *)&local_d0);
    if (*(long *)this == 0) goto LAB_00125ef1;
  }
  (*env->_vptr_Env[8])(&local_90,env,&local_b0);
  Status::~Status(&local_90);
LAB_00125ef1:
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_58);
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}